

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::write_pixel
          (Image *this,ssize_t x,ssize_t y,uint64_t r,uint64_t g,uint64_t b,uint64_t a)

{
  bool bVar1;
  logic_error *this_00;
  long lVar2;
  code *pcVar3;
  undefined *puVar4;
  byte bVar5;
  
  if ((((y | x) < 0) || (this->width <= x)) || (this->height <= y)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range((out_of_range *)this_00,"out of bounds");
    puVar4 = &::std::out_of_range::typeinfo;
    pcVar3 = ::std::out_of_range::~out_of_range;
    goto LAB_00108d85;
  }
  bVar5 = this->channel_width << 5 | (byte)(this->channel_width - 8) >> 3;
  if (bVar5 < 8) {
    bVar1 = this->has_alpha;
    lVar2 = ((ulong)bVar1 + 3) * (this->width * y + x);
    switch(bVar5) {
    case 0:
      *(char *)((long)(this->data).raw + lVar2) = (char)r;
      *(char *)((long)(this->data).raw + lVar2 + 1) = (char)g;
      *(char *)((long)(this->data).raw + lVar2 + 2) = (char)b;
      if (this->has_alpha == true) {
        *(char *)((long)(this->data).raw + lVar2 + 3) = (char)a;
      }
      break;
    case 1:
      *(short *)((long)(this->data).raw + lVar2 * 2) = (short)r;
      *(short *)((long)(this->data).raw + lVar2 * 2 + 2) = (short)g;
      *(short *)((long)(this->data).raw + lVar2 * 2 + 4) = (short)b;
      if (bVar1 != false) {
        *(short *)((long)(this->data).raw + lVar2 * 2 + 6) = (short)a;
      }
      break;
    default:
      goto switchD_00108ca7_caseD_2;
    case 3:
      *(int *)((long)(this->data).raw + lVar2 * 4) = (int)r;
      *(int *)((long)(this->data).raw + lVar2 * 4 + 4) = (int)g;
      *(int *)((long)(this->data).raw + lVar2 * 4 + 8) = (int)b;
      if (bVar1 != false) {
        *(int *)((long)(this->data).raw + lVar2 * 4 + 0xc) = (int)a;
      }
      break;
    case 7:
      *(uint64_t *)((long)(this->data).raw + lVar2 * 8) = r;
      *(uint64_t *)((long)(this->data).raw + lVar2 * 8 + 8) = g;
      *(uint64_t *)((long)(this->data).raw + lVar2 * 8 + 0x10) = b;
      if (bVar1 != false) {
        *(uint64_t *)((long)(this->data).raw + lVar2 * 8 + 0x18) = a;
      }
    }
    return;
  }
switchD_00108ca7_caseD_2:
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"image channel width is not 8, 16, 32, or 64");
  puVar4 = &::std::logic_error::typeinfo;
  pcVar3 = ::std::logic_error::~logic_error;
LAB_00108d85:
  __cxa_throw(this_00,puVar4,pcVar3);
}

Assistant:

void Image::write_pixel(ssize_t x, ssize_t y, uint64_t r, uint64_t g,
    uint64_t b, uint64_t a) {

  // check coordinates
  if (x < 0 || y < 0 || x >= this->width || y >= this->height) {
    throw out_of_range("out of bounds");
  }

  size_t index = (y * this->width + x) * (this->has_alpha ? 4 : 3);
  if (this->channel_width == 8) {
    this->data.as8[index] = r;
    this->data.as8[index + 1] = g;
    this->data.as8[index + 2] = b;
    if (this->has_alpha) {
      this->data.as8[index + 3] = a;
    }
  } else if (this->channel_width == 16) {
    this->data.as16[index] = r;
    this->data.as16[index + 1] = g;
    this->data.as16[index + 2] = b;
    if (this->has_alpha) {
      this->data.as16[index + 3] = a;
    }
  } else if (this->channel_width == 32) {
    this->data.as32[index] = r;
    this->data.as32[index + 1] = g;
    this->data.as32[index + 2] = b;
    if (this->has_alpha) {
      this->data.as32[index + 3] = a;
    }
  } else if (this->channel_width == 64) {
    this->data.as64[index] = r;
    this->data.as64[index + 1] = g;
    this->data.as64[index + 2] = b;
    if (this->has_alpha) {
      this->data.as64[index + 3] = a;
    }
  } else {
    throw logic_error("image channel width is not 8, 16, 32, or 64");
  }
}